

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O0

vector<GGMNode,_std::allocator<GGMNode>_> * __thiscall
GGMTree::min_coverage
          (vector<GGMNode,_std::allocator<GGMNode>_> *__return_storage_ptr__,GGMTree *this,
          vector<GGMNode,_std::allocator<GGMNode>_> *node_list)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  size_type sVar6;
  vector<GGMNode,_std::allocator<GGMNode>_> local_d0;
  undefined4 local_b4;
  GGMNode local_b0;
  long local_90;
  value_type node2;
  undefined1 local_60 [8];
  value_type node1;
  undefined1 local_38 [4];
  int i;
  vector<GGMNode,_std::allocator<GGMNode>_> next_level_node;
  vector<GGMNode,_std::allocator<GGMNode>_> *node_list_local;
  GGMTree *this_local;
  
  next_level_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)node_list;
  std::vector<GGMNode,_std::allocator<GGMNode>_>::vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_38);
  node1._28_4_ = 0;
  do {
    uVar3 = (ulong)(int)node1._28_4_;
    sVar4 = std::vector<GGMNode,_std::allocator<GGMNode>_>::size(node_list);
    if (sVar4 <= uVar3) {
      sVar4 = std::vector<GGMNode,_std::allocator<GGMNode>_>::size
                        ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_38);
      sVar6 = std::vector<GGMNode,_std::allocator<GGMNode>_>::size(node_list);
      if ((sVar4 == sVar6) ||
         (bVar1 = std::vector<GGMNode,_std::allocator<GGMNode>_>::empty
                            ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_38), bVar1)) {
        std::vector<GGMNode,_std::allocator<GGMNode>_>::vector(__return_storage_ptr__,node_list);
      }
      else {
        std::vector<GGMNode,_std::allocator<GGMNode>_>::vector
                  (&local_d0,(vector<GGMNode,_std::allocator<GGMNode>_> *)local_38);
        min_coverage(__return_storage_ptr__,this,&local_d0);
        std::vector<GGMNode,_std::allocator<GGMNode>_>::~vector(&local_d0);
      }
      local_b4 = 1;
      std::vector<GGMNode,_std::allocator<GGMNode>_>::~vector
                ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_38);
      return __return_storage_ptr__;
    }
    pvVar5 = std::vector<GGMNode,_std::allocator<GGMNode>_>::operator[]
                       (node_list,(long)(int)node1._28_4_);
    local_60 = (undefined1  [8])pvVar5->index;
    node1.index._0_4_ = pvVar5->level;
    node1.index._4_1_ = pvVar5->key[0];
    node1.index._5_1_ = pvVar5->key[1];
    node1.index._6_1_ = pvVar5->key[2];
    node1.index._7_1_ = pvVar5->key[3];
    node1._8_8_ = *(undefined8 *)(pvVar5->key + 4);
    node1.key._4_8_ = *(undefined8 *)(pvVar5->key + 0xc);
    iVar2 = node1._28_4_ + 1;
    sVar4 = std::vector<GGMNode,_std::allocator<GGMNode>_>::size(node_list);
    if ((long)iVar2 == sVar4) {
      std::vector<GGMNode,std::allocator<GGMNode>>::emplace_back<GGMNode&>
                ((vector<GGMNode,std::allocator<GGMNode>> *)local_38,(GGMNode *)local_60);
    }
    else {
      pvVar5 = std::vector<GGMNode,_std::allocator<GGMNode>_>::operator[]
                         (node_list,(long)(node1._28_4_ + 1));
      local_90 = pvVar5->index;
      node2.index._0_4_ = pvVar5->level;
      node2.index._4_1_ = pvVar5->key[0];
      node2.index._5_1_ = pvVar5->key[1];
      node2.index._6_1_ = pvVar5->key[2];
      node2.index._7_1_ = pvVar5->key[3];
      node2._8_8_ = *(undefined8 *)(pvVar5->key + 4);
      node2.key._4_8_ = *(undefined8 *)(pvVar5->key + 0xc);
      if ((long)local_60 >> 1 == local_90 >> 1) {
        if ((int)node1.index == (undefined4)node2.index) {
          GGMNode::GGMNode(&local_b0,(long)local_60 >> 1,(int)node1.index + -1);
          std::vector<GGMNode,_std::allocator<GGMNode>_>::emplace_back<GGMNode>
                    ((vector<GGMNode,_std::allocator<GGMNode>_> *)local_38,&local_b0);
          node1._28_4_ = node1._28_4_ + 1;
          goto LAB_00106b11;
        }
      }
      std::vector<GGMNode,std::allocator<GGMNode>>::emplace_back<GGMNode&>
                ((vector<GGMNode,std::allocator<GGMNode>> *)local_38,(GGMNode *)local_60);
    }
LAB_00106b11:
    node1._28_4_ = node1._28_4_ + 1;
  } while( true );
}

Assistant:

vector<GGMNode> GGMTree::min_coverage(vector<GGMNode> node_list) {
    vector<GGMNode> next_level_node;

    for (int i = 0; i < node_list.size(); ++i) {
        auto node1 = node_list[i];

        if(i + 1 == node_list.size()) {
            next_level_node.emplace_back(node1);
        } else {
            auto node2 = node_list[i + 1];
            // same parent in the binary path
            if(((node1.index >> 1) == (node2.index >> 1)) && (node1.level == node2.level)) {
                next_level_node.emplace_back(GGMNode(node1.index >> 1, node1.level - 1));
                i++;
            } else {
                next_level_node.emplace_back(node1);
            }
        }
    }

    // no merge return
    if (next_level_node.size() == node_list.size() || next_level_node.empty()) {
        return node_list;
    }

    return min_coverage(next_level_node);
}